

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void fetchTransformedBilinear_pixelBounds<(TextureBlendType)4>
               (int param_1,int l1,int l2,int *v1,int *v2)

{
  int *v2_local;
  int *v1_local;
  int l2_local;
  int l1_local;
  int param_0_local;
  
  if (*v1 < l1) {
    *v1 = l1;
    *v2 = l1;
  }
  else if (*v1 < l2) {
    *v2 = *v1 + 1;
  }
  else {
    *v1 = l2;
    *v2 = l2;
  }
  return;
}

Assistant:

inline void fetchTransformedBilinear_pixelBounds<BlendTransformedBilinear>(int, int l1, int l2, int &v1, int &v2)
{
    if (v1 < l1)
        v2 = v1 = l1;
    else if (v1 >= l2)
        v2 = v1 = l2;
    else
        v2 = v1 + 1;
    Q_ASSERT(v1 >= l1 && v1 <= l2);
    Q_ASSERT(v2 >= l1 && v2 <= l2);
}